

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_solve.cpp
# Opt level: O0

void __thiscall Clasp::mt::ParallelHandler::clearDB(ParallelHandler *this,Solver *s)

{
  iterator ppCVar1;
  long in_RSI;
  Constraint *in_RDI;
  uint32 i;
  ClauseHead *c;
  iterator end;
  iterator it;
  Constraint *pCVar2;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar3;
  iterator local_18;
  
  local_18 = bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::begin
                       ((pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *)
                        (in_RDI + 8));
  ppCVar1 = bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::end
                      ((pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *)
                       (in_RDI + 8));
  for (; local_18 != ppCVar1; local_18 = local_18 + 1) {
    pCVar2 = *local_18;
    if (in_RSI == 0) {
      (*pCVar2->_vptr_Constraint[5])(pCVar2,0,0);
    }
    else {
      (*pCVar2->_vptr_Constraint[0x13])();
      Solver::addLearnt((Solver *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        in_RDI,(uint32)((ulong)pCVar2 >> 0x20),(ConstraintType)pCVar2);
    }
  }
  bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::clear
            ((pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *)(in_RDI + 8));
  *(undefined4 *)((long)&in_RDI[10]._vptr_Constraint + 4) = 0;
  for (iVar3 = 0; iVar3 != *(int *)&in_RDI[10]._vptr_Constraint; iVar3 = iVar3 + 1) {
    SharedLiterals::release((SharedLiterals *)0x21ed3b);
  }
  *(undefined4 *)&in_RDI[10]._vptr_Constraint = 0;
  return;
}

Assistant:

void ParallelHandler::clearDB(Solver* s) {
	for (ClauseDB::iterator it = integrated_.begin(), end = integrated_.end(); it != end; ++it) {
		ClauseHead* c = static_cast<ClauseHead*>(*it);
		if (s) { s->addLearnt(c, c->size(), Constraint_t::Other); }
		else   { c->destroy(); }
	}
	integrated_.clear();
	intEnd_= 0;
	for (uint32 i = 0; i != recEnd_; ++i) { received_[i]->release(); }
	recEnd_= 0;
}